

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char *pcVar2;
  Ch *pCVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar9;
  byte bVar10;
  uint16_t uVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  int iVar18;
  uint uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  
  pcVar2 = is->src_;
  pCVar3 = is->head_;
  cVar1 = *pcVar2;
  pbVar17 = (byte *)(pcVar2 + (cVar1 == '-'));
  bVar10 = pcVar2[cVar1 == '-'];
  if (bVar10 == 0x30) {
    pbVar16 = pbVar17 + 1;
    bVar6 = false;
    iVar7 = 0;
    uVar15 = 0;
    uVar19 = 0;
    goto LAB_00109a7a;
  }
  if ((byte)(bVar10 - 0x31) < 9) {
    uVar19 = bVar10 - 0x30;
    bVar10 = pbVar17[1];
    pbVar16 = pbVar17 + 1;
    if (cVar1 == '-') {
      if ((byte)(bVar10 - 0x30) < 10) {
        iVar7 = 0;
        do {
          if ((0xccccccb < uVar19) && ('8' < (char)bVar10 || uVar19 != 0xccccccc))
          goto LAB_00109a70;
          uVar19 = ((uint)bVar10 + uVar19 * 10) - 0x30;
          iVar7 = iVar7 + 1;
          bVar10 = pbVar16[1];
          pbVar16 = pbVar16 + 1;
        } while ((byte)(bVar10 - 0x30) < 10);
      }
      else {
LAB_0010a192:
        iVar7 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar10 - 0x30)) goto LAB_0010a192;
      iVar7 = 0;
      do {
        if ((0x19999998 < uVar19) && ('5' < (char)bVar10 || uVar19 != 0x19999999))
        goto LAB_00109a70;
        uVar19 = ((uint)bVar10 + uVar19 * 10) - 0x30;
        iVar7 = iVar7 + 1;
        bVar10 = pbVar16[1];
        pbVar16 = pbVar16 + 1;
      } while ((byte)(bVar10 - 0x30) < 10);
    }
    bVar6 = false;
    uVar15 = 0;
    goto LAB_00109a7a;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                  ,0x60c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar14 = (long)pbVar17 - (long)pCVar3;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0010a1a4;
LAB_00109a70:
  bVar6 = true;
  uVar15 = uVar19;
LAB_00109a7a:
  uVar8 = (ulong)uVar15;
  dVar24 = 0.0;
  if (bVar6) {
    bVar10 = *pbVar16;
    bVar13 = bVar10 - 0x30;
    if (cVar1 == '-') {
      while (bVar13 < 10) {
        if ((0xccccccccccccccb < uVar8) && (uVar8 != 0xccccccccccccccc || '8' < (char)bVar10))
        goto LAB_00109b7d;
        uVar8 = (ulong)(bVar10 & 0xf) + uVar8 * 10;
        iVar7 = iVar7 + 1;
        bVar10 = pbVar16[1];
        pbVar16 = pbVar16 + 1;
        bVar13 = bVar10 - 0x30;
      }
    }
    else {
      while (bVar13 < 10) {
        if ((0x1999999999999998 < uVar8) && (uVar8 != 0x1999999999999999 || '5' < (char)bVar10))
        goto LAB_00109b7d;
        uVar8 = (ulong)(bVar10 & 0xf) + uVar8 * 10;
        iVar7 = iVar7 + 1;
        bVar10 = pbVar16[1];
        pbVar16 = pbVar16 + 1;
        bVar13 = bVar10 - 0x30;
      }
    }
  }
  bVar4 = false;
  goto LAB_00109ba5;
LAB_00109b7d:
  auVar21._8_4_ = (int)(uVar8 >> 0x20);
  auVar21._0_8_ = uVar8;
  auVar21._12_4_ = 0x45300000;
  dVar24 = (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  bVar4 = true;
LAB_00109ba5:
  if (bVar4) {
    bVar10 = *pbVar16;
    while ((byte)(bVar10 - 0x30) < 10) {
      dVar24 = dVar24 * 10.0 + (double)(int)(bVar10 - 0x30);
      pbVar17 = pbVar16 + 1;
      pbVar16 = pbVar16 + 1;
      bVar10 = *pbVar17;
    }
  }
  pbVar17 = pbVar16 + (*pbVar16 == 0x2e);
  iVar18 = 0;
  uVar12 = uVar8;
  if (*pbVar16 == 0x2e) {
    if (0xf5 < (byte)(*pbVar17 - 0x3a)) {
      iVar18 = 0;
      if (!bVar4) {
        uVar12 = (ulong)uVar19;
        if (bVar6) {
          uVar12 = uVar8;
        }
        bVar10 = *pbVar17;
        iVar18 = 0;
        if ((0xf5 < (byte)(bVar10 - 0x3a)) && (iVar18 = 0, uVar12 < 0x20000000000000)) {
          lVar14 = 0;
          do {
            uVar12 = ((ulong)bVar10 & 0xf) + uVar12 * 10;
            iVar7 = (uint)(uVar12 != 0) + iVar7;
            bVar10 = pbVar17[lVar14 + 1];
            lVar14 = lVar14 + 1;
            if ((byte)(bVar10 - 0x3a) < 0xf6) break;
          } while (uVar12 < 0x20000000000000);
          iVar18 = -(int)lVar14;
          pbVar17 = pbVar17 + lVar14;
        }
        auVar22._8_4_ = (int)(uVar12 >> 0x20);
        auVar22._0_8_ = uVar12;
        auVar22._12_4_ = 0x45300000;
        dVar24 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
        bVar4 = true;
      }
      bVar10 = *pbVar17;
      while ((byte)(bVar10 - 0x30) < 10) {
        if (iVar7 < 0x11) {
          dVar24 = dVar24 * 10.0 + (double)(int)(bVar10 - 0x30);
          iVar18 = iVar18 + -1;
          if (0.0 < dVar24) {
            iVar7 = iVar7 + 1;
          }
        }
        pbVar16 = pbVar17 + 1;
        pbVar17 = pbVar17 + 1;
        bVar10 = *pbVar16;
      }
      goto LAB_00109d22;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                    ,0x637,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar14 = (long)pbVar17 - (long)pCVar3;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
LAB_00109d22:
    lVar14 = (long)pcVar2 - (long)pCVar3;
    bVar10 = *pbVar17;
    pbVar17 = pbVar17 + (bVar10 == 0x65);
    if (bVar10 == 0x65) {
LAB_00109d5f:
      uVar8 = (ulong)uVar19;
      if (bVar6) {
        uVar8 = uVar12;
      }
      if (!bVar4) {
        auVar23._8_4_ = (int)(uVar8 >> 0x20);
        auVar23._0_8_ = uVar8;
        auVar23._12_4_ = 0x45300000;
        dVar24 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
        bVar4 = true;
      }
      bVar10 = *pbVar17;
      pbVar17 = pbVar17 + (bVar10 == 0x2b);
      bVar20 = false;
      if (bVar10 != 0x2b) {
        bVar20 = *pbVar17 == 0x2d;
        pbVar17 = pbVar17 + bVar20;
      }
      bVar10 = *pbVar17;
      if ((byte)(bVar10 - 0x30) < 10) {
        pbVar17 = pbVar17 + 1;
        iVar7 = bVar10 - 0x30;
        if (bVar20) {
          if (0 < iVar18) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                          ,0x677,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar10 = *pbVar17;
          if ((byte)(bVar10 - 0x30) < 10) {
            do {
              iVar7 = (uint)bVar10 + iVar7 * 10 + -0x30;
              if ((iVar18 + 0x7ffffff7) / 10 < iVar7) {
                do {
                  pbVar16 = pbVar17 + 1;
                  pbVar17 = pbVar17 + 1;
                } while ((byte)(*pbVar16 - 0x30) < 10);
              }
              else {
                pbVar17 = pbVar17 + 1;
              }
              bVar10 = *pbVar17;
            } while ((byte)(bVar10 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar10 = *pbVar17;
            bVar13 = bVar10 - 0x30;
            if (9 < bVar13) goto LAB_00109ea5;
            pbVar17 = pbVar17 + 1;
            iVar7 = (uint)bVar10 + iVar7 * 10 + -0x30;
          } while (iVar7 <= 0x134 - iVar18);
          ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
LAB_00109ea5:
          if (bVar13 < 10) {
            bVar20 = false;
            goto LAB_00109ecb;
          }
        }
        iVar5 = -iVar7;
        if (!bVar20) {
          iVar5 = iVar7;
        }
        iVar7 = iVar5;
        bVar20 = true;
      }
      else {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        bVar20 = false;
        iVar7 = 0;
      }
LAB_00109ecb:
      if (!bVar20) goto LAB_0010a0eb;
    }
    else {
      bVar10 = *pbVar17;
      pbVar17 = pbVar17 + (bVar10 == 0x45);
      iVar7 = 0;
      if (bVar10 == 0x45) goto LAB_00109d5f;
    }
    if (bVar4) {
      uVar15 = iVar7 + iVar18;
      if ((int)uVar15 < -0x134) {
        dVar25 = 0.0;
        if (-0x269 < (int)uVar15) {
          uVar15 = -uVar15 - 0x134;
          if (0x134 < uVar15) goto LAB_0010a1cc;
          dVar24 = dVar24 / 1e+308;
LAB_0010a05c:
          dVar25 = dVar24 / *(double *)(internal::Pow10(int)::e + (ulong)uVar15 * 8);
        }
      }
      else {
        if ((int)uVar15 < 0) {
          uVar15 = -uVar15;
          if (0x134 < uVar15) goto LAB_0010a1cc;
          goto LAB_0010a05c;
        }
        if (0x134 < uVar15) {
LAB_0010a1cc:
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        dVar25 = dVar24 * *(double *)(internal::Pow10(int)::e + (ulong)uVar15 * 8);
      }
      if (dVar25 <= 1.79769313486232e+308) {
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        if (cVar1 == '-') {
          dVar25 = -dVar25;
        }
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        *(double *)&pGVar9->data_ = dVar25;
        (pGVar9->data_).f.flags = 0x216;
        bVar6 = true;
        bVar4 = false;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                        ,0x6bb,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar14;
        bVar4 = true;
        bVar6 = true;
      }
    }
    else {
      if (bVar6) {
        if (cVar1 != '-') {
          pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                             (&handler->stack_,1);
          (pGVar9->data_).n = (Number)0x0;
          (pGVar9->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar9->data_ = uVar12;
          uVar11 = (ushort)((uVar12 & 0xffffffff80000000) == 0) * 0x20 +
                   ((ushort)(uVar12 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar12) << 7) + 0x116;
LAB_0010a03a:
          (pGVar9->data_).f.flags = uVar11;
          goto LAB_0010a03e;
        }
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar12);
      }
      else {
        if (cVar1 != '-') {
          pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                             (&handler->stack_,1);
          (pGVar9->data_).n = (Number)0x0;
          (pGVar9->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar9->data_ = (ulong)uVar19;
          uVar11 = (ushort)(-1 < (int)uVar19) << 5 | 0x1d6;
          goto LAB_0010a03a;
        }
        pGVar9 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        uVar11 = 0xb6;
        if ((int)uVar19 < 1) {
          uVar11 = 0x1f6;
        }
        (pGVar9->data_).n = (Number)0x0;
        (pGVar9->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar9->data_ = (long)(int)-uVar19;
        (pGVar9->data_).f.flags = uVar11;
LAB_0010a03e:
        bVar6 = true;
      }
      bVar4 = false;
    }
    if ((bVar4) || (bVar6 != false)) goto LAB_0010a0eb;
    ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this);
  }
LAB_0010a1a4:
  *(long *)(this + 0x38) = lVar14;
LAB_0010a0eb:
  is->src_ = (Ch *)pbVar17;
  is->head_ = pCVar3;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        typedef typename internal::SelectIf<internal::BoolType<(parseFlags & kParseNumbersAsStringsFlag) != 0>, typename TargetEncoding::Ch, char>::Type NumberCharacter;

        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, NumberCharacter,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                GenericStringStream<UTF8<NumberCharacter> > srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<typename TargetEncoding::Ch>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const NumberCharacter* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }